

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

state ** State_arrayof(void)

{
  int iVar1;
  s_x3node *psVar2;
  s_x3 *psVar3;
  state **ppsVar4;
  long lVar5;
  
  psVar3 = x3a;
  if (x3a != (s_x3 *)0x0) {
    iVar1 = x3a->count;
    ppsVar4 = (state **)calloc((long)iVar1,8);
    if (ppsVar4 != (state **)0x0) {
      if (iVar1 < 1) {
        return ppsVar4;
      }
      psVar2 = psVar3->tbl;
      lVar5 = 0;
      do {
        *(undefined8 *)((long)ppsVar4 + lVar5) = *(undefined8 *)((long)&psVar2->data + lVar5 * 4);
        lVar5 = lVar5 + 8;
      } while ((long)iVar1 * 8 != lVar5);
      return ppsVar4;
    }
  }
  return (state **)0x0;
}

Assistant:

struct state **State_arrayof()
{
  struct state **array;
  int i,size;
  if( x3a==0 ) return 0;
  size = x3a->count;
  array = (struct state **)calloc(size, sizeof(struct state *));
  if( array ){
    for(i=0; i<size; i++) array[i] = x3a->tbl[i].data;
  }
  return array;
}